

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O2

ssize_t __thiscall
LinkedReadsDatastore::write(LinkedReadsDatastore *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  void *__buf_00;
  undefined4 in_register_00000034;
  
  sdglib::write_string((ofstream *)CONCAT44(in_register_00000034,__fd),&this->filename);
  sdglib::write_string((ofstream *)CONCAT44(in_register_00000034,__fd),&this->name);
  sVar1 = LinkedReadsMapper::write(&this->mapper,__fd,__buf_00,__n);
  return sVar1;
}

Assistant:

void LinkedReadsDatastore::write(std::ofstream &output_file) {
    //read filename
    sdglib::write_string(output_file, filename);
    sdglib::write_string(output_file, name);

    mapper.write(output_file);
}